

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_rgb.c
# Opt level: O2

void rgb24_yuv420_std(uint32_t width,uint32_t height,uint8_t *RGB,uint32_t RGB_stride,uint8_t *Y,
                     uint8_t *U,uint8_t *V,uint32_t Y_stride,uint32_t UV_stride,YCbCrType yuv_type)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint8_t uVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint8_t *puVar25;
  uint uVar26;
  ulong local_a8;
  
  uVar15 = (ulong)yuv_type;
  iVar13 = RGB_stride * 2;
  iVar14 = Y_stride * 2;
  local_a8 = 0;
  uVar20 = 0;
  for (uVar22 = 0; uVar22 < height - 1; uVar22 = uVar22 + 2) {
    uVar19 = (ulong)((uVar22 >> 1) * UV_stride);
    puVar25 = RGB;
    for (lVar21 = 0; (uint)lVar21 < width - 1; lVar21 = lVar21 + 2) {
      bVar1 = RGB2YUV[uVar15].r_factor;
      bVar2 = puVar25[local_a8];
      bVar3 = RGB2YUV[uVar15].g_factor;
      bVar4 = RGB2YUV[uVar15].b_factor;
      bVar5 = puVar25[local_a8 + 2];
      uVar23 = (uint)bVar5 * (uint)bVar4 +
               (uint)puVar25[local_a8 + 1] * (uint)bVar3 + (uint)bVar2 * (uint)bVar1 >> 8 & 0xff;
      uVar16 = (uint)RGB2YUV[uVar15].y_factor;
      uVar6 = RGB2YUV[uVar15].y_offset;
      Y[lVar21 + (ulong)uVar20] = (char)(uVar23 * uVar16 >> 7) + uVar6;
      bVar7 = puVar25[local_a8 + 3];
      bVar8 = puVar25[local_a8 + 5];
      uVar26 = (uint)bVar8 * (uint)bVar4 +
               (uint)puVar25[local_a8 + 4] * (uint)bVar3 + (uint)bVar7 * (uint)bVar1 >> 8 & 0xff;
      Y[lVar21 + (ulong)uVar20 + 1] = (char)(uVar26 * uVar16 >> 7) + uVar6;
      bVar9 = puVar25[RGB_stride];
      bVar10 = puVar25[(ulong)RGB_stride + 2];
      uVar17 = (uint)bVar10 * (uint)bVar4 +
               (uint)puVar25[(ulong)RGB_stride + 1] * (uint)bVar3 + (uint)bVar9 * (uint)bVar1 >> 8 &
               0xff;
      Y[lVar21 + (ulong)Y_stride] = (char)(uVar17 * uVar16 >> 7) + uVar6;
      bVar11 = puVar25[(ulong)RGB_stride + 3];
      bVar12 = puVar25[(ulong)RGB_stride + 5];
      uVar24 = (uint)bVar4 * (uint)bVar12 +
               (uint)puVar25[(ulong)RGB_stride + 4] * (uint)bVar3 + (uint)bVar1 * (uint)bVar11 >> 8
               & 0xff;
      iVar18 = uVar17 + uVar26 + uVar24;
      Y[lVar21 + (ulong)Y_stride + 1] = (char)(uVar24 * uVar16 >> 7) + uVar6;
      U[uVar19] = (char)((uint)RGB2YUV[uVar15].cb_factor *
                         ((((uint)bVar10 + (uint)bVar12 + (uint)bVar5 + (uint)bVar8) - iVar18) -
                          uVar23 >> 2) >> 8) + 0x80;
      V[uVar19] = (char)((uint)RGB2YUV[uVar15].cr_factor *
                         (((uint)bVar7 + (uint)bVar9 + (uint)bVar11 + (bVar2 - uVar23)) - iVar18 >>
                         2) >> 8) + 0x80;
      puVar25 = puVar25 + 6;
      uVar19 = uVar19 + 1;
    }
    RGB_stride = RGB_stride + iVar13;
    uVar20 = uVar20 + iVar14;
    Y_stride = Y_stride + iVar14;
    local_a8 = (ulong)(uint)((int)local_a8 + iVar13);
  }
  return;
}

Assistant:

void rgb24_yuv420_std(
	uint32_t width, uint32_t height, 
	const uint8_t *RGB, uint32_t RGB_stride, 
	uint8_t *Y, uint8_t *U, uint8_t *V, uint32_t Y_stride, uint32_t UV_stride, 
	YCbCrType yuv_type)
{
	const RGB2YUVParam *const param = &(RGB2YUV[yuv_type]);
	
	uint32_t x, y;
	for(y=0; y<(height-1); y+=2)
	{
		const uint8_t *rgb_ptr1=RGB+y*RGB_stride,
			*rgb_ptr2=RGB+(y+1)*RGB_stride;
		
		uint8_t *y_ptr1=Y+y*Y_stride,
			*y_ptr2=Y+(y+1)*Y_stride,
			*u_ptr=U+(y/2)*UV_stride,
			*v_ptr=V+(y/2)*UV_stride;
		
		for(x=0; x<(width-1); x+=2)
		{
			// compute yuv for the four pixels, u and v values are summed
			uint8_t y_tmp;
			int16_t u_tmp, v_tmp;
			
			y_tmp = (param->r_factor*rgb_ptr1[0] + param->g_factor*rgb_ptr1[1] + param->b_factor*rgb_ptr1[2])>>8;
			u_tmp = rgb_ptr1[2]-y_tmp;
			v_tmp = rgb_ptr1[0]-y_tmp;
			y_ptr1[0]=((y_tmp*param->y_factor)>>7) + param->y_offset;
			
			y_tmp = (param->r_factor*rgb_ptr1[3] + param->g_factor*rgb_ptr1[4] + param->b_factor*rgb_ptr1[5])>>8;
			u_tmp += rgb_ptr1[5]-y_tmp;
			v_tmp += rgb_ptr1[3]-y_tmp;
			y_ptr1[1]=((y_tmp*param->y_factor)>>7) + param->y_offset;

			y_tmp = (param->r_factor*rgb_ptr2[0] + param->g_factor*rgb_ptr2[1] + param->b_factor*rgb_ptr2[2])>>8;
			u_tmp += rgb_ptr2[2]-y_tmp;
			v_tmp += rgb_ptr2[0]-y_tmp;
			y_ptr2[0]=((y_tmp*param->y_factor)>>7) + param->y_offset;
			
			y_tmp = (param->r_factor*rgb_ptr2[3] + param->g_factor*rgb_ptr2[4] + param->b_factor*rgb_ptr2[5])>>8;
			u_tmp += rgb_ptr2[5]-y_tmp;
			v_tmp += rgb_ptr2[3]-y_tmp;
			y_ptr2[1]=((y_tmp*param->y_factor)>>7) + param->y_offset;

			u_ptr[0] = (((u_tmp>>2)*param->cb_factor)>>8) + 128;
			v_ptr[0] = (((v_tmp>>2)*param->cr_factor)>>8) + 128;
			
			rgb_ptr1 += 6;
			rgb_ptr2 += 6;
			y_ptr1 += 2;
			y_ptr2 += 2;
			u_ptr += 1;
			v_ptr += 1;
		}
	}
}